

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int tinyexr::LevelSize(int toplevel_size,int level,int tile_rounding_mode)

{
  int *piVar1;
  int in_EDX;
  byte in_SIL;
  int in_EDI;
  int level_size;
  int b;
  int local_18;
  int local_14;
  int local_10;
  
  local_10 = 1 << (in_SIL & 0x1f);
  local_14 = in_EDI / local_10;
  if ((in_EDX == 1) && (local_14 * local_10 < in_EDI)) {
    local_14 = local_14 + 1;
  }
  local_18 = 1;
  piVar1 = std::max<int>(&local_14,&local_18);
  return *piVar1;
}

Assistant:

static int LevelSize(int toplevel_size, int level, int tile_rounding_mode) {
  assert(level >= 0);

  int b = static_cast<int>(1u << static_cast<unsigned int>(level));
  int level_size = toplevel_size / b;

  if (tile_rounding_mode == TINYEXR_TILE_ROUND_UP && level_size * b < toplevel_size)
    level_size += 1;

  return std::max(level_size, 1);
}